

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

bool __thiscall
ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches(ThreadContext *this,DynamicObject *object)

{
  bool bVar1;
  DynamicObject *object_local;
  ThreadContext *this_local;
  
  bVar1 = JsUtil::
          BaseDictionary<int,SList<Js::InlineCache*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          MapUntil<ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches(Js::DynamicObject*)::__0>
                    ((BaseDictionary<int,SList<Js::InlineCache*,Memory::ArenaAllocator,RealCount>*,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)&this->storeFieldInlineCacheByPropId,(anon_class_8_1_6424947d_for_fn)object)
  ;
  return bVar1;
}

Assistant:

bool
ThreadContext::IsObjectRegisteredInStoreFieldInlineCaches(Js::DynamicObject * object)
{
    return storeFieldInlineCacheByPropId.MapUntil([object](Js::PropertyId propertyId, InlineCacheList* inlineCacheList)
    {
        FOREACH_SLISTBASE_ENTRY(Js::InlineCache*, inlineCache, inlineCacheList)
        {
            if (inlineCache != nullptr && !inlineCache->IsEmpty())
            {
                // Verify this object is not present in prototype chain of inlineCache's type
                bool isObjectPresentOnPrototypeChain =
                    Js::JavascriptOperators::MapObjectAndPrototypesUntil<true>(inlineCache->GetType()->GetPrototype(), [=](Js::RecyclableObject* prototype)
                {
                    return prototype == object;
                });
                if (isObjectPresentOnPrototypeChain) {
                    return true;
                }
            }
        }
        NEXT_SLISTBASE_ENTRY;
        return false;
    });
}